

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

int TestReintersectConvex(ShapeHandle *shape,RNG *rng)

{
  ShapeIntersection *this;
  byte bVar1;
  bool bVar2;
  Float *pFVar3;
  float *pfVar4;
  Point3f *pPVar5;
  int c;
  int iVar6;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  *this_00;
  int c_2;
  int iVar7;
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar12 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 extraout_var [60];
  undefined1 auVar17 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Point3<float> PVar22;
  Vector3<float> VVar23;
  Vector3f VVar24;
  Point3f PVar25;
  Point2f u;
  Bounds3f bbox;
  optional<pbrt::ShapeIntersection> si;
  Tuple3<pbrt::Vector3,_float> local_308;
  undefined1 local_2f8 [8];
  undefined1 local_2f0 [16];
  ShapeIntersection *local_2e0;
  Tuple2<pbrt::Point2,_float> local_2d8;
  int local_2d0;
  int local_2cc;
  float local_2c8;
  Float local_2c4;
  Normal3f *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  anon_struct_8_0_00000001_for___align local_2a8;
  float fStack_294;
  Float FStack_290;
  MediumHandle local_288;
  Ray local_280;
  Bounds3<float> local_258;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_240;
  byte local_140;
  optional<pbrt::ShapeIntersection> local_138;
  undefined1 auVar16 [64];
  undefined8 uVar18;
  undefined1 auVar19 [56];
  
  local_2b0 = 0;
  local_2c4 = 0.0;
  local_2f0._8_8_ = shape;
  for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
    FVar8 = pExp(rng,8.0);
    pFVar3 = (Float *)&local_2b0;
    if ((iVar6 != 0) && (pFVar3 = (Float *)((long)&local_2b0 + 4), iVar6 != 1)) {
      pFVar3 = &local_2c4;
    }
    *pFVar3 = FVar8;
  }
  pbrt::
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Bounds()const::_lambda(auto:1)_1_>
            (&local_258,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)local_2f0._8_8_);
  local_2b8 = 0;
  local_2c8 = 0.0;
  for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
    fVar9 = pbrt::RNG::Uniform<float>(rng);
    pfVar4 = (float *)&local_2b8;
    if ((iVar6 != 0) && (pfVar4 = (float *)((long)&local_2b8 + 4), iVar6 != 1)) {
      pfVar4 = &local_2c8;
    }
    *pfVar4 = fVar9;
  }
  PVar25.super_Tuple3<pbrt::Point3,_float>.z = local_2c8;
  PVar25.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_2b8;
  PVar25.super_Tuple3<pbrt::Point3,_float>.y = (float)local_2b8._4_4_;
  auVar19 = ZEXT856(0);
  PVar22 = pbrt::Bounds3<float>::Lerp(&local_258,PVar25);
  auVar11._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar19;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_2b0;
  auVar20 = vsubps_avx(auVar11._0_16_,auVar20);
  local_280.d.super_Tuple3<pbrt::Vector3,_float>.z =
       PVar22.super_Tuple3<pbrt::Point3,_float>.z - local_2c4;
  local_280.o.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_2b0;
  local_280.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_2b0._4_4_;
  local_280.o.super_Tuple3<pbrt::Point3,_float>.z = local_2c4;
  local_280.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
  local_280.time = 0.0;
  local_280.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  fVar9 = pbrt::RNG::Uniform<float>(rng);
  if (fVar9 < 0.5) {
    auVar19 = extraout_var_00;
    VVar23 = pbrt::Normalize<float>(&local_280.d);
    local_280.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar19;
    local_280.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12._0_16_);
  }
  this_00 = (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
             *)local_2f0._8_8_;
  pbrt::ShapeHandle::Intersect(&local_138,(ShapeHandle *)local_2f0._8_8_,&local_280,INFINITY);
  iVar6 = 0;
  if (local_138.set == true) {
    local_2e0 = pstd::optional<pbrt::ShapeIntersection>::value(&local_138);
    local_2c0 = &(local_2e0->intr).super_Interaction.n;
    iVar6 = 0;
    iVar7 = 0;
    while (iVar7 != 1000) {
      local_2d8.x = 0.0;
      local_2d8.y = 0.0;
      fVar9 = pbrt::RNG::Uniform<float>(rng);
      local_2d8.x = fVar9;
      fVar9 = pbrt::RNG::Uniform<float>(rng);
      local_2d8.y = fVar9;
      auVar19 = extraout_var_01;
      VVar24 = pbrt::SampleUniformSphere((Point2f *)&local_2d8);
      local_308.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar19;
      local_308._0_8_ = vmovlps_avx(auVar13._0_16_);
      VVar23 = pbrt::FaceForward<float>((Vector3<float> *)&local_308,local_2c0);
      local_308.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar14._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar19;
      local_308._0_8_ = vmovlps_avx(auVar14._0_16_);
      local_2cc = iVar7;
      pbrt::Interaction::SpawnRay
                ((RayDifferential *)&local_240.__align,(Interaction *)local_2e0,
                 (Vector3f *)&local_308);
      fStack_294 = (float)local_240._20_4_;
      FStack_290 = (Float)local_240._24_4_;
      local_2a8 = local_240.__align;
      local_288.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_240._32_8_;
      bVar2 = pbrt::ShapeHandle::IntersectP((ShapeHandle *)this_00,(Ray *)&local_2a8,INFINITY);
      auVar15 = ZEXT464(0x7f800000);
      pbrt::ShapeHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align,(ShapeHandle *)this_00,
                 (Ray *)&local_2a8,INFINITY);
      bVar1 = local_140;
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align);
      local_2f8 = (undefined1  [8])0x0;
      local_2f0._0_4_ = 0.0;
      local_2d0 = iVar6 + (uint)bVar1 + (uint)bVar2;
      for (iVar6 = 0; auVar19 = auVar15._8_56_, iVar6 != 3; iVar6 = iVar6 + 1) {
        auVar15._0_4_ = pExp(rng,8.0);
        auVar15._4_60_ = extraout_var;
        pPVar5 = (Point3f *)local_2f8;
        if ((iVar6 != 0) && (pPVar5 = (Point3f *)(local_2f8 + 4), iVar6 != 1)) {
          pPVar5 = (Point3f *)local_2f0;
        }
        (pPVar5->super_Tuple3<pbrt::Point3,_float>).x = auVar15._0_4_;
      }
      PVar25 = pbrt::Interaction::p((Interaction *)local_2e0);
      this_00 = (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                 *)local_2f0._8_8_;
      auVar16._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar16._8_56_ = auVar19;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_2f8;
      auVar20 = vsubps_avx(auVar21,auVar16._0_16_);
      auVar19 = ZEXT856(auVar20._8_8_);
      local_308.z = (float)local_2f0._0_4_ - PVar25.super_Tuple3<pbrt::Point3,_float>.z;
      local_308._0_8_ = vmovlps_avx(auVar20);
      VVar23 = pbrt::FaceForward<float>((Vector3<float> *)&local_308,local_2c0);
      this = local_2e0;
      uVar18 = auVar19._0_8_;
      local_308.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar19;
      local_308._0_8_ = vmovlps_avx(auVar17._0_16_);
      PVar25 = pbrt::Interaction::p((Interaction *)local_2e0);
      local_2f0._0_4_ = PVar25.super_Tuple3<pbrt::Point3,_float>.z + local_308.z;
      auVar10._0_4_ = PVar25.super_Tuple3<pbrt::Point3,_float>.x + local_308.x;
      auVar10._4_4_ = PVar25.super_Tuple3<pbrt::Point3,_float>.y + local_308.y;
      auVar10._8_4_ = (float)uVar18 + 0.0;
      auVar10._12_4_ = (float)((ulong)uVar18 >> 0x20) + 0.0;
      local_2f8 = (undefined1  [8])vmovlps_avx(auVar10);
      pbrt::Interaction::SpawnRayTo
                ((Ray *)&local_240.__align,(Interaction *)this,(Point3f *)local_2f8);
      fStack_294 = (float)local_240._20_4_;
      FStack_290 = (Float)local_240._24_4_;
      local_2a8 = local_240.__align;
      local_288.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_240._32_8_;
      bVar2 = pbrt::ShapeHandle::IntersectP((ShapeHandle *)this_00,(Ray *)&local_2a8,1.0);
      pbrt::ShapeHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align,(ShapeHandle *)this_00,
                 (Ray *)&local_2a8,1.0);
      iVar6 = local_2d0 + (uint)local_140 + (uint)bVar2;
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align);
      iVar7 = local_2cc + 1;
    }
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&local_138);
  return iVar6;
}

Assistant:

static int TestReintersectConvex(ShapeHandle shape, RNG &rng) {
    // Ray origin
    Point3f o;
    for (int c = 0; c < 3; ++c)
        o[c] = pExp(rng);

    // Destination: a random point in the shape's bounding box.
    Bounds3f bbox = shape.Bounds();
    Point3f t;
    for (int c = 0; c < 3; ++c)
        t[c] = rng.Uniform<Float>();
    Point3f p2 = bbox.Lerp(t);

    // Ray to intersect with the shape.
    Ray r(o, p2 - o);
    if (rng.Uniform<Float>() < .5)
        r.d = Normalize(r.d);

    // We should usually (but not always) find an intersection.
    auto si = shape.Intersect(r);
    if (!si)
        return 0;
    SurfaceInteraction &isect = si->intr;

    // Now trace a bunch of rays leaving the intersection point.
    int n = 0;
    for (int j = 0; j < 1000; ++j) {
        // Random direction leaving the intersection point.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Vector3f w = SampleUniformSphere(u);
        // Make sure it's in the same hemisphere as the surface normal.
        w = FaceForward(w, isect.n);
        Ray rOut = isect.SpawnRay(w);

        if (shape.IntersectP(rOut))
            ++n;
        if (shape.Intersect(rOut).has_value())
            ++n;

        // Choose a random point to trace rays to.
        Point3f p2;
        for (int c = 0; c < 3; ++c)
            p2[c] = pExp(rng);
        // Make sure that the point we're tracing rays toward is in the
        // hemisphere about the intersection point's surface normal.
        w = p2 - isect.p();
        w = FaceForward(w, isect.n);
        p2 = isect.p() + w;
        rOut = isect.SpawnRayTo(p2);

        if (shape.IntersectP(rOut, 1))
            ++n;
        if (shape.Intersect(rOut, 1).has_value())
            ++n;
    }

    return n;
}